

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1016::run(TestCase1016 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  size_t sVar2;
  ArrayPtr<const_capnp::word> *pAVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_368;
  size_t local_358;
  uint local_350;
  bool local_349;
  undefined1 auStack_348 [7];
  bool _kj_shouldLog_5;
  size_t local_340;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_338;
  size_t local_328;
  uint local_320;
  bool local_319;
  undefined1 auStack_318 [7];
  bool _kj_shouldLog_4;
  size_t local_310;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_308;
  size_t local_2f8;
  uint local_2f0;
  bool local_2e9;
  undefined1 auStack_2e8 [7];
  bool _kj_shouldLog_3;
  size_t local_2e0;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_2d8;
  size_t local_2c8;
  uint local_2bc;
  Fault local_2b8;
  Fault f;
  Builder local_2a0;
  BuilderFor<capnproto_test::capnp::test::TestNewVersion> local_288;
  Builder local_260;
  bool local_241;
  undefined1 local_240 [7];
  bool _kj_shouldLog_2;
  BuilderFor<capnproto_test::capnp::test::TestNewVersion> local_228;
  Builder local_200;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_1e8;
  size_t local_1d8;
  uint local_1d0;
  bool local_1c9;
  undefined1 auStack_1c8 [7];
  bool _kj_shouldLog_1;
  size_t local_1c0;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_1b8;
  size_t local_1a8;
  uint local_1a0;
  bool local_199;
  undefined1 auStack_198 [7];
  bool _kj_shouldLog;
  size_t local_190;
  ArrayPtr<const_char> local_188;
  Builder local_178;
  BuilderFor<capnproto_test::capnp::test::TestOldVersion> local_160;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase1016 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)this_00,6,FIXED_SIZE);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_178,(Builder *)local_128);
  AnyPointer::Builder::initAs<capnproto_test::capnp::test::TestOldVersion>(&local_160,&local_178);
  Text::Reader::Reader((Reader *)&local_188,"foo");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2(&local_160,(Reader)local_188);
  _auStack_198 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_198);
  if (sVar2 != 1) {
    local_199 = kj::_::Debug::shouldLog(ERROR);
    while (local_199 != false) {
      local_1a0 = 1;
      AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
      local_1b8 = AVar4;
      local_1a8 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size(&local_1b8);
      kj::_::Debug::log<char_const(&)[65],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x401,ERROR,
                 "\"failed: expected \" \"(1u) == (builder.getSegmentsForOutput().size())\", 1u, builder.getSegmentsForOutput().size()"
                 ,(char (*) [65])"failed: expected (1u) == (builder.getSegmentsForOutput().size())",
                 &local_1a0,&local_1a8);
      local_199 = false;
    }
  }
  _auStack_1c8 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_1c8,0);
  sVar2 = kj::ArrayPtr<const_capnp::word>::size(pAVar3);
  if (sVar2 != 6) {
    local_1c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c9 != false) {
      local_1d0 = 6;
      AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
      local_1e8 = AVar4;
      pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_1e8,0);
      local_1d8 = kj::ArrayPtr<const_capnp::word>::size(pAVar3);
      kj::_::Debug::log<char_const(&)[68],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x402,ERROR,
                 "\"failed: expected \" \"(6u) == (builder.getSegmentsForOutput()[0].size())\", 6u, builder.getSegmentsForOutput()[0].size()"
                 ,(char (*) [68])
                  "failed: expected (6u) == (builder.getSegmentsForOutput()[0].size())",&local_1d0,
                 &local_1d8);
      local_1c9 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)local_240,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestNewVersion>
            (&local_228,(Builder *)local_240);
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld2(&local_200,&local_228);
  bVar1 = capnp::operator==("foo",&local_200);
  if (!bVar1) {
    local_241 = kj::_::Debug::shouldLog(ERROR);
    while (local_241 != false) {
      capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
                (&local_2a0,(Builder *)local_128);
      AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestNewVersion>(&local_288,&local_2a0)
      ;
      capnproto_test::capnp::test::TestNewVersion::Builder::getOld2(&local_260,&local_288);
      kj::_::Debug::log<char_const(&)[96],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x405,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (root.getAnyPointerField().getAs<test::TestNewVersion>().getOld2())\", \"foo\", root.getAnyPointerField().getAs<test::TestNewVersion>().getOld2()"
                 ,(char (*) [96])
                  "failed: expected (\"foo\") == (root.getAnyPointerField().getAs<test::TestNewVersion>().getOld2())"
                 ,(char (*) [4])"foo",&local_260);
      local_241 = false;
    }
  }
  AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  f.exception = (Exception *)AVar4.ptr;
  sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f);
  if (sVar2 != 3) {
    local_2bc = 3;
    local_2d8 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
    local_2c8 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size(&local_2d8);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_long>
              (&local_2b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x409,FAILED,"(3u) == (builder.getSegmentsForOutput().size())",
               "3u, builder.getSegmentsForOutput().size()",&local_2bc,&local_2c8);
    kj::_::Debug::Fault::fatal(&local_2b8);
  }
  _auStack_2e8 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_2e8,0);
  sVar2 = kj::ArrayPtr<const_capnp::word>::size(pAVar3);
  if (sVar2 != 6) {
    local_2e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e9 != false) {
      local_2f0 = 6;
      AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
      local_308 = AVar4;
      pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_308,0);
      local_2f8 = kj::ArrayPtr<const_capnp::word>::size(pAVar3);
      kj::_::Debug::log<char_const(&)[68],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x40a,ERROR,
                 "\"failed: expected \" \"(6u) == (builder.getSegmentsForOutput()[0].size())\", 6u, builder.getSegmentsForOutput()[0].size()"
                 ,(char (*) [68])
                  "failed: expected (6u) == (builder.getSegmentsForOutput()[0].size())",&local_2f0,
                 &local_2f8);
      local_2e9 = false;
    }
  }
  _auStack_318 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_318,1);
  sVar2 = kj::ArrayPtr<const_capnp::word>::size(pAVar3);
  if (sVar2 != 6) {
    local_319 = kj::_::Debug::shouldLog(ERROR);
    while (local_319 != false) {
      local_320 = 6;
      AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
      local_338 = AVar4;
      pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_338,1);
      local_328 = kj::ArrayPtr<const_capnp::word>::size(pAVar3);
      kj::_::Debug::log<char_const(&)[68],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x40b,ERROR,
                 "\"failed: expected \" \"(6u) == (builder.getSegmentsForOutput()[1].size())\", 6u, builder.getSegmentsForOutput()[1].size()"
                 ,(char (*) [68])
                  "failed: expected (6u) == (builder.getSegmentsForOutput()[1].size())",&local_320,
                 &local_328);
      local_319 = false;
    }
  }
  _auStack_348 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_348,2);
  sVar2 = kj::ArrayPtr<const_capnp::word>::size(pAVar3);
  if (sVar2 != 2) {
    local_349 = kj::_::Debug::shouldLog(ERROR);
    while (local_349 != false) {
      local_350 = 2;
      AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
      local_368 = AVar4;
      pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_368,2);
      local_358 = kj::ArrayPtr<const_capnp::word>::size(pAVar3);
      kj::_::Debug::log<char_const(&)[68],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x40c,ERROR,
                 "\"failed: expected \" \"(2u) == (builder.getSegmentsForOutput()[2].size())\", 2u, builder.getSegmentsForOutput()[2].size()"
                 ,(char (*) [68])
                  "failed: expected (2u) == (builder.getSegmentsForOutput()[2].size())",&local_350,
                 &local_358);
      local_349 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, UpgradeStructInBuilderDoubleFarPointers) {
  // Force allocation of a double-Far pointer.

  MallocMessageBuilder builder(6, AllocationStrategy::FIXED_SIZE);
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().initAs<test::TestOldVersion>().setOld2("foo");

  // We should have allocated all of the first segment.
  EXPECT_EQ(1u, builder.getSegmentsForOutput().size());
  EXPECT_EQ(6u, builder.getSegmentsForOutput()[0].size());

  // Now if we upgrade...
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<test::TestNewVersion>().getOld2());

  // We should have allocated the new struct in a new segment, and also allocated the far pointer
  // landing pad in yet another segment.
  ASSERT_EQ(3u, builder.getSegmentsForOutput().size());
  EXPECT_EQ(6u, builder.getSegmentsForOutput()[0].size());
  EXPECT_EQ(6u, builder.getSegmentsForOutput()[1].size());
  EXPECT_EQ(2u, builder.getSegmentsForOutput()[2].size());
}